

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall file_base_0::test_method(file_base_0 *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  char *local_1a0;
  basic_cstring<const_char> local_198;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_188;
  basic_cstring<const_char> local_160;
  basic_cstring<const_char> local_150;
  char *local_140;
  basic_cstring<const_char> local_138;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_128;
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  char *local_e0;
  basic_cstring<const_char> local_d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c8;
  basic_cstring<const_char> local_a0;
  basic_cstring<const_char> local_90;
  char *local_80 [3];
  basic_cstring<const_char> local_68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_58;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  file_base_0 *local_10;
  file_base_0 *this_local;
  
  local_10 = this;
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_20,10,&local_30);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_58,plVar3,(char (*) [1])0x29cec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
               ,0x60);
    local_80[0] = assert_hash::file_base("a",0);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[2]>
              (&local_58,&local_68,10,1,2,local_80,"ah::file_base( \"a\" )","a","\"a\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_90,0xb,&local_a0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c8,plVar3,(char (*) [1])0x29cec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
               ,0x60);
    local_e0 = assert_hash::file_base("a.txt",0);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[6]>
              (&local_c8,&local_d8,0xb,1,2,&local_e0,"ah::file_base( \"a.txt\" )","a.txt",
               "\"a.txt\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_100);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_f0,0xc,&local_100);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_128,plVar3,(char (*) [1])0x29cec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
               ,0x60);
    local_140 = assert_hash::file_base(".a.txt",0);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[7]>
              (&local_128,&local_138,0xc,1,2,&local_140,"ah::file_base( \".a.txt\" )",".a.txt",
               "\".a.txt\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_128);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_160);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_150,0xd,&local_160);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_188,plVar3,(char (*) [1])0x29cec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
               ,0x60);
    local_1a0 = assert_hash::file_base("c:\\asd\\.a.txt",0);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[14]>
              (&local_188,&local_198,0xd,1,2,&local_1a0,"ah::file_base( \"c:\\\\asd\\\\.a.txt\" )",
               "c:\\asd\\.a.txt","\"c:\\\\asd\\\\.a.txt\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( file_base_0 )
{
    BOOST_CHECK_EQUAL( ah::file_base( "a" ), "a" );
    BOOST_CHECK_EQUAL( ah::file_base( "a.txt" ), "a.txt" );
    BOOST_CHECK_EQUAL( ah::file_base( ".a.txt" ), ".a.txt" );
    BOOST_CHECK_EQUAL( ah::file_base( "c:\\asd\\.a.txt" ), "c:\\asd\\.a.txt" );
}